

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O0

void __thiscall TSMuxer::writePATPMT(TSMuxer *this,int64_t pcr,bool force)

{
  int64_t local_30;
  bool force_local;
  int64_t pcr_local;
  TSMuxer *this_local;
  
  if (((pcr == -1) || ((long)this->m_patPmtDelta <= pcr - this->m_lastPMTPCR)) || (force)) {
    local_30 = pcr;
    if (pcr == -1) {
      local_30 = this->m_fixed_pcr_offset;
    }
    this->m_lastPMTPCR = local_30;
    writePAT(this);
    writePMT(this);
    if ((force) || (0x12c64 < pcr - this->m_lastSITPCR)) {
      this->m_lastSITPCR = pcr;
      writeSIT(this);
    }
  }
  return;
}

Assistant:

void TSMuxer::writePATPMT(const int64_t pcr, const bool force)
{
    if (pcr == -1 || pcr - m_lastPMTPCR >= m_patPmtDelta || force)
    {
        m_lastPMTPCR = pcr != -1 ? pcr : m_fixed_pcr_offset;
        writePAT();
        writePMT();
        if (force || pcr - m_lastSITPCR > SIT_INTERVAL)
        {
            m_lastSITPCR = pcr;
            writeSIT();
        }
    }
}